

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Descriptor *pDVar5;
  GeneratorOptions *options_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  Printer *pPVar11;
  FieldDescriptor *pFVar12;
  Printer *pPVar13;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *desc;
  FieldDescriptor *field_03;
  FieldDescriptor *extraout_RDX;
  char *pcVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  BytesMode BVar17;
  undefined1 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  undefined1 in_stack_fffffffffffffed8;
  string value_type;
  undefined1 local_f8 [32];
  string key_type;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  char local_68 [16];
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    value_type._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
               (FieldDescriptor **)&value_type);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    pDVar5 = FieldDescriptor::message_type(field);
    options_00 = (GeneratorOptions *)Descriptor::FindFieldByNumber(pDVar5,1);
    pDVar5 = FieldDescriptor::message_type(field);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)Descriptor::FindFieldByNumber(pDVar5,2);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,options_00,(FieldDescriptor *)0x0,true,
               false,false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffed8);
    pFVar12 = (FieldDescriptor *)0x0;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)paVar6,
               (FieldDescriptor *)0x0,true,false,false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffed8
              );
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              ((string *)local_f8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar12
              );
    pbVar19 = &key_type;
    BVar17 = 0x398bfa;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,
               "/**\n * $fielddef$\n * @param {boolean=} opt_noLazyCreate Do not create the map if\n * empty, instead returning `undefined`\n * @return {!jspb.Map<$keytype$,$valuetype$>}\n */\n"
               ,(char (*) [9])"fielddef",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [8])"keytype",pbVar19,(char (*) [10])"valuetype",&value_type);
    uVar18 = SUB81(pbVar19,0);
    if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_f8,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)&local_98,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x3d58ec);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_b8.field_2._8_8_ = plVar7[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b8._M_string_length = plVar7[1];
    pbVar19 = &local_b8;
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    BVar17 = 0x398c86;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,
               "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n"
               ,(char (*) [6])0x39ef2d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [11])"gettername",pbVar19,(char (*) [8])"keytype",&key_type,
               (char (*) [10])"valuetype",&value_type);
    uVar18 = SUB81(pbVar19,0);
    pPVar11 = (Printer *)(local_f8 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((Printer *)local_f8._0_8_ != pPVar11) {
      operator_delete((void *)local_f8._0_8_);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"gettername","gettername",field);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)local_f8,(_anonymous_namespace_ *)field,field_02);
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,"      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
               (char (*) [6])0x3a4ffa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    if ((Printer *)local_f8._0_8_ != pPVar11) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((once_flag *)
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(paVar6->_M_local_buf + 0x30))->_M_allocated_capacity != (once_flag *)0x0) {
      local_f8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_b8._M_dataplus._M_p = (pointer)paVar6;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                ((once_flag *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar6->_M_local_buf + 0x30))->_M_allocated_capacity,
                 (_func_void_FieldDescriptor_ptr **)local_f8,(FieldDescriptor **)&local_b8);
    }
    if (*(int *)(paVar6->_M_local_buf + 0x38) == 0xb) {
      pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)paVar6->_M_local_buf);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_f8,
                 (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,pDVar5);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,",\n      $messageType$",(char (*) [12])"messageType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      if ((Printer *)local_f8._0_8_ != pPVar11) {
        operator_delete((void *)local_f8._0_8_);
      }
    }
    else {
      io::Printer::Print<>(printer,",\n      null");
    }
    io::Printer::Print<>(printer,"));\n");
    pcVar15 = "};\n\n\n";
    io::Printer::Print<>(printer,"};\n\n\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
LAB_0024eaf8:
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  else {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      value_type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
                 (FieldDescriptor **)&value_type);
    }
    uVar4 = *(uint *)(field + 0x38);
    BVar17 = 0x3e1b10;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar4 * 4) == 10) {
      (anonymous_namespace)::FieldDefinition_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      (anonymous_namespace)::FieldComments_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,BVar17);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_f8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
                 (bool)in_stack_fffffffffffffed8);
      BVar17 = 0x3d81f8;
      pbVar19 = &value_type;
      io::Printer::
      Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
                (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
                 (char (*) [9])"fielddef",&key_type,(char (*) [8])0x3d81f8,pbVar19,
                 (char (*) [5])0x3e7763,(string *)local_f8);
      uVar18 = SUB81(pbVar19,0);
      if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != &key_type.field_2) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
                 *(Descriptor **)(field + 0x50));
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_f8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x3d58ec);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        value_type.field_2._M_allocated_capacity = *psVar10;
        value_type.field_2._8_8_ = plVar7[3];
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
      }
      else {
        value_type.field_2._M_allocated_capacity = *psVar10;
        value_type._M_dataplus._M_p = (pointer)*plVar7;
      }
      value_type._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (&local_b8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
                 (bool)in_stack_fffffffffffffed8);
      pFVar12 = (FieldDescriptor *)0x3d811a;
      local_50._M_allocated_capacity = (size_type)"";
      if (*(int *)(field + 0x3c) == 3) {
        local_50._M_allocated_capacity = (size_type)"Repeated";
      }
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,field_00);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                ((string *)&local_78,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 pFVar12);
      local_58 = ", 1";
      if (*(int *)(field + 0x3c) != 2) {
        local_58 = "";
      }
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[5],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[13],std::__cxx11::string,char[9],char_const*>
                (printer,
                 "$class$.prototype.$gettername$ = function() {\n  return /** @type{$type$} */ (\n    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, $index$$required$));\n};\n\n\n"
                 ,(char (*) [6])0x39ef2d,&key_type,(char (*) [11])"gettername",&value_type,
                 (char (*) [5])0x3e7763,&local_b8,(char (*) [4])"rpt",
                 (char **)&local_50._M_allocated_capacity,(char (*) [6])0x3a4ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (char (*) [13])"wrapperclass",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 (char (*) [9])"required",(char **)(local_68 + 0x10));
      paVar6 = &key_type.field_2;
      if ((char *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != paVar6) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"gettername","gettername",field);
      BVar17 = BYTES_DEFAULT;
      uVar18 = 0;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
                 (bool)in_stack_fffffffffffffed8);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
                 *(Descriptor **)(field + 0x50));
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
      pPVar11 = (Printer *)(local_f8 + 0x10);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3d2edd);
      pPVar13 = (Printer *)(puVar8 + 2);
      if ((Printer *)*puVar8 == pPVar13) {
        local_f8._16_8_ = *(undefined8 *)pPVar13;
        local_f8._24_8_ = puVar8[3];
        local_f8._0_8_ = pPVar11;
      }
      else {
        local_f8._16_8_ = *(undefined8 *)pPVar13;
        local_f8._0_8_ = (Printer *)*puVar8;
      }
      local_f8._8_8_ = puVar8[1];
      *puVar8 = pPVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_98._M_allocated_capacity = (size_type)"Oneof";
      if (*(long *)(field + 0x58) == 0) {
        local_98._M_allocated_capacity = (size_type)"";
      }
      local_78._M_allocated_capacity = (size_type)"Repeated";
      if (*(int *)(field + 0x3c) != 3) {
        local_78._M_allocated_capacity = (size_type)"";
      }
      io::Printer::
      Print<char[13],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[12],char_const*>
                (printer,
                 "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n*/\n$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField("
                 ,(char (*) [13])"optionaltype",&key_type,(char (*) [6])0x39ef2d,&value_type,
                 (char (*) [11])"settername",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 (char (*) [9])"oneoftag",(char **)&local_98._M_allocated_capacity,
                 (char (*) [12])"repeatedtag",(char **)&local_78._M_allocated_capacity);
      paVar9 = &value_type.field_2;
      if ((Printer *)local_f8._0_8_ != pPVar11) {
        operator_delete((void *)local_f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != paVar9) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != paVar6) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)field,field_01);
      lVar1 = *(long *)(field + 0x58);
      if (lVar1 == 0) {
        value_type._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value_type,"");
      }
      else {
        (anonymous_namespace)::JSOneofArray_abi_cxx11_
                  ((string *)local_f8,
                   (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                   (GeneratorOptions *)(options->namespace_prefix)._M_string_length,field);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x3af5c0);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          value_type.field_2._M_allocated_capacity = *psVar10;
          value_type.field_2._8_8_ = plVar7[3];
          value_type._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          value_type.field_2._M_allocated_capacity = *psVar10;
          value_type._M_dataplus._M_p = (pointer)*plVar7;
        }
        value_type._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
      }
      pcVar15 = "this, $index$$oneofgroup$, value);\n};\n\n\n";
      BVar17 = 0x3993b1;
      pbVar19 = &value_type;
      io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"this, $index$$oneofgroup$, value);\n};\n\n\n",(char (*) [6])0x3a4ffa,
                 &key_type,(char (*) [11])0x3993b1,pbVar19);
      uVar18 = SUB81(pbVar19,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != paVar9) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((lVar1 != 0) && ((Printer *)local_f8._0_8_ != pPVar11)) {
        operator_delete((void *)local_f8._0_8_);
      }
      _Var16._M_p = key_type._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != paVar6) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      if (*(int *)(field + 0x3c) == 3) {
        pcVar15 = (char *)options;
        GenerateRepeatedMessageHelperMethods((Generator *)_Var16._M_p,options,printer,field);
      }
      goto LAB_0024eafd;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      value_type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
                 (FieldDescriptor **)&value_type);
      uVar4 = *(uint *)(field + 0x38);
    }
    uVar2 = options->binary ^ 1;
    if (uVar4 != 0xc) {
      uVar2 = 0;
    }
    pFVar12 = (FieldDescriptor *)0x0;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,SUB41(uVar2,0),BYTES_DEFAULT,
               (bool)in_stack_fffffffffffffed8);
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar12);
    (anonymous_namespace)::FieldComments_abi_cxx11_
              ((string *)local_f8,(_anonymous_namespace_ *)field,(FieldDescriptor *)(ulong)uVar2,
               (BytesMode)pFVar12);
    BVar17 = 0x3d81f8;
    pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
               (char (*) [9])"fielddef",&value_type,(char (*) [8])0x3d81f8,pbVar19,
               (char (*) [5])0x3e7763,&key_type);
    uVar18 = SUB81(pbVar19,0);
    if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3d58ec);
    local_f8._0_8_ = local_f8 + 0x10;
    pPVar11 = (Printer *)(plVar7 + 2);
    if ((Printer *)*plVar7 == pPVar11) {
      local_f8._16_8_ = *(undefined8 *)pPVar11;
      local_f8._24_8_ = plVar7[3];
    }
    else {
      local_f8._16_8_ = *(undefined8 *)pPVar11;
      local_f8._0_8_ = (Printer *)*plVar7;
    }
    local_f8._8_8_ = plVar7[1];
    *plVar7 = (long)pPVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,"$class$.prototype.$gettername$ = function() {\n",(char (*) [6])0x39ef2d,
               &value_type,(char (*) [11])"gettername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    paVar6 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar6) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"gettername","gettername",field);
    pcVar15 = "  return /** @type {$type$} */ (";
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"  return /** @type {$type$} */ (",(char (*) [5])0x3e7763,&key_type);
    pFVar12 = field;
    bVar3 = anon_unknown_0::ReturnsNullWhenUnset
                      ((GeneratorOptions *)field,(FieldDescriptor *)pcVar15);
    GenerateFieldValueExpression
              ((Generator *)pFVar12,printer,"this",field,*(int *)(field + 0x3c) != 3 && !bVar3);
    io::Printer::Print<>(printer,");\n};\n\n\n");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      value_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_f8._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&value_type,
                 (FieldDescriptor **)local_f8);
    }
    if (*(int *)(field + 0x38) == 0xc) {
      GenerateBytesWrapper(options,printer,field,BYTES_B64);
      GenerateBytesWrapper(options,printer,field,BYTES_U8);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              ((string *)local_f8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_fffffffffffffed8);
    pcVar15 = "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n";
    BVar17 = 0x398eb2;
    pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    io::Printer::Print<char[6],std::__cxx11::string,char[13],std::__cxx11::string>
              (printer,
               "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n",
               (char (*) [6])0x39ef2d,&value_type,(char (*) [13])"optionaltype",pbVar19);
    uVar18 = SUB81(pbVar19,0);
    if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) && (*(int *)(field + 0x3c) != 3)) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        pcVar15 = (char *)&value_type;
        value_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_f8._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)pcVar15,
                   (FieldDescriptor **)local_f8);
      }
      if (((*(int *)(field + 0x38) == 0xb) &&
          (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) ||
         (bVar3 = anon_unknown_0::HasFieldPresence
                            ((GeneratorOptions *)field,(FieldDescriptor *)pcVar15), bVar3))
      goto LAB_0024e301;
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
                 *(Descriptor **)(field + 0x50));
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "set",&local_b8);
      (anonymous_namespace)::JSTypeTag_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,desc);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)&local_78,(_anonymous_namespace_ *)field,field_03);
      BVar17 = 0x398ebf;
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,
                 "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.setProto3$typetag$Field(this, $index$, value);\n};\n\n\n"
                 ,(char (*) [6])0x39ef2d,&value_type,(char (*) [11])"settername",pbVar19,
                 (char (*) [8])"typetag",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (char (*) [6])0x3a4ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
      uVar18 = SUB81(pbVar19,0);
      if ((char *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar6) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      pcVar15 = "settername";
      _Var16._M_p = &printer->variable_delimiter_;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
    }
    else {
LAB_0024e301:
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
                 *(Descriptor **)(field + 0x50));
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3d2edd);
      local_f8._0_8_ = local_f8 + 0x10;
      pPVar11 = (Printer *)(puVar8 + 2);
      if ((Printer *)*puVar8 == pPVar11) {
        local_f8._16_8_ = *(undefined8 *)pPVar11;
        local_f8._24_8_ = puVar8[3];
      }
      else {
        local_f8._16_8_ = *(undefined8 *)pPVar11;
        local_f8._0_8_ = (Printer *)*puVar8;
      }
      local_f8._8_8_ = puVar8[1];
      *puVar8 = pPVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pcVar14 = "";
      local_78._M_allocated_capacity = (size_type)"Oneof";
      if (*(long *)(field + 0x58) == 0) {
        local_78._M_allocated_capacity = (size_type)"";
      }
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,
                 (FieldDescriptor *)local_f8._8_8_);
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[6],std::__cxx11::string>
                (printer,
                 "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$Field(this, $index$"
                 ,(char (*) [6])0x39ef2d,&value_type,(char (*) [11])"settername",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 (char (*) [9])"oneoftag",(char **)&local_78._M_allocated_capacity,
                 (char (*) [6])0x3a4ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar6) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
      local_b8._M_dataplus._M_p = "";
      local_98._M_allocated_capacity = (long)" \t" + 2;
      lVar1 = *(long *)(field + 0x58);
      if (lVar1 == 0) {
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value_type,"");
      }
      else {
        (anonymous_namespace)::JSOneofArray_abi_cxx11_
                  ((string *)local_f8,
                   (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                   (GeneratorOptions *)(options->namespace_prefix)._M_string_length,field);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x3af5c0);
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          value_type.field_2._M_allocated_capacity = *psVar10;
          value_type.field_2._8_8_ = plVar7[3];
        }
        else {
          value_type.field_2._M_allocated_capacity = *psVar10;
          value_type._M_dataplus._M_p = (pointer)*plVar7;
        }
        value_type._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
      }
      if (*(int *)(field + 0x3c) == 3) {
        pcVar14 = " || []";
      }
      pcVar15 = "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n";
      BVar17 = 0x3990d6;
      paVar6 = &local_98;
      local_78._M_allocated_capacity = (size_type)pcVar14;
      io::Printer::
      Print<char[5],char_const*,char[10],char_const*,char[11],std::__cxx11::string,char[13],char_const*>
                (printer,"$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n",
                 (char (*) [5])0x3e7763,(char **)&local_b8,(char (*) [10])"typeclose",
                 (char **)&paVar6->_M_allocated_capacity,(char (*) [11])0x3993b1,&value_type,
                 (char (*) [13])"rptvalueinit",(char **)&local_78._M_allocated_capacity);
      uVar18 = SUB81(paVar6,0);
      _Var16 = value_type._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((lVar1 != 0) &&
         (_Var16._M_p = (pointer)local_f8._0_8_,
         (Printer *)local_f8._0_8_ != (Printer *)(local_f8 + 0x10))) {
        operator_delete((void *)local_f8._0_8_);
      }
    }
    if (*(int *)(field + 0x3c) == 3) {
      BVar17 = BYTES_DEFAULT;
      pcVar15 = (char *)options;
      GenerateRepeatedPrimitiveHelperMethods((Generator *)_Var16._M_p,options,printer,field,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) goto LAB_0024eaf8;
  }
LAB_0024eafd:
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    pcVar15 = (char *)&key_type;
    key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    value_type._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)pcVar15,
               (FieldDescriptor **)&value_type);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    BVar17 = 5;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3991c6);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type.field_2._8_8_ = plVar7[3];
      value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)&local_78,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x3d58ec);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar6) {
      local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_88._8_8_ = puVar8[3];
      local_98._M_allocated_capacity = (size_type)&local_88;
    }
    else {
      local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_98._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_98._8_8_ = puVar8[1];
    *puVar8 = paVar6;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    BVar17 = 0x3991ba;
    pbVar19 = &value_type;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "/**\n * Clears values from the map. The map will be non-null.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  this.$gettername$().clear();\n  return this;};\n\n\n"
               ,(char (*) [6])0x39ef2d,&key_type,(char (*) [12])"clearername",pbVar19,
               (char (*) [11])"gettername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
    uVar18 = SUB81(pbVar19,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((char *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  else {
    if (*(int *)(field + 0x3c) == 3) {
LAB_0024ebb4:
      pcVar15 = "Clears the list making it empty but non-null.";
    }
    else {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        pcVar15 = (char *)&key_type;
        key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        value_type._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)pcVar15,
                   (FieldDescriptor **)&value_type);
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10)
         || (*(int *)(field + 0x3c) == 2)) {
        bVar3 = anon_unknown_0::HasFieldPresence
                          ((GeneratorOptions *)field,(FieldDescriptor *)pcVar15);
        if (bVar3) {
          (anonymous_namespace)::GetMessagePath_abi_cxx11_
                    (&key_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p
                     ,(GeneratorOptions *)(options->namespace_prefix)._M_string_length,
                     *(Descriptor **)(field + 0x50));
          (anonymous_namespace)::JSGetterName_abi_cxx11_
                    (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                     (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3991c6);
          value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar10) {
            value_type.field_2._M_allocated_capacity = *psVar10;
            value_type.field_2._8_8_ = plVar7[3];
          }
          else {
            value_type.field_2._M_allocated_capacity = *psVar10;
            value_type._M_dataplus._M_p = (pointer)*plVar7;
          }
          value_type._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          lVar1 = *(long *)(field + 0x58);
          local_58 = "Oneof";
          if (lVar1 == 0) {
            local_58 = "";
            local_98._M_allocated_capacity = (size_type)&local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
            pFVar12 = extraout_RDX;
          }
          else {
            (anonymous_namespace)::JSOneofArray_abi_cxx11_
                      ((string *)&local_78,
                       (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                       (GeneratorOptions *)(options->namespace_prefix)._M_string_length,field);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x3af5c0);
            local_98._M_allocated_capacity = (size_type)&local_88;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 == paVar6) {
              local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_88._8_8_ = puVar8[3];
            }
            else {
              local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_98._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
            }
            pFVar12 = (FieldDescriptor *)puVar8[1];
            *puVar8 = paVar6;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            local_98._8_8_ = pFVar12;
          }
          (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                    ((string *)&local_50,(_anonymous_namespace_ *)field,pFVar12);
          BVar17 = 0x3991ba;
          pbVar19 = &value_type;
          io::Printer::
          Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],char_const*,char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,
                     "/**\n * Clears the field making it undefined.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return jspb.Message.set$maybeoneof$Field(this, $index$$maybeoneofgroup$, "
                     ,(char (*) [6])0x39ef2d,&key_type,(char (*) [12])"clearername",pbVar19,
                     (char (*) [11])"maybeoneof",(char **)(local_68 + 0x10),
                     (char (*) [16])"maybeoneofgroup",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     (char (*) [6])0x3a4ffa,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
          ;
          uVar18 = SUB81(pbVar19,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_allocated_capacity != &local_40) {
            operator_delete((void *)local_50._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity);
          }
          if ((lVar1 != 0) && ((char *)local_78._M_allocated_capacity != local_68)) {
            operator_delete((void *)local_78._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value_type._M_dataplus._M_p != &value_type.field_2) {
            operator_delete(value_type._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)key_type._M_dataplus._M_p != &key_type.field_2) {
            operator_delete(key_type._M_dataplus._M_p);
          }
          io::Printer::Annotate<google::protobuf::FieldDescriptor>
                    (printer,"clearername","clearername",field);
          key_type._M_dataplus._M_p = "undefined";
          if (*(int *)(field + 0x3c) == 3) {
            key_type._M_dataplus._M_p = "[]";
          }
          pcVar15 = "$clearedvalue$);\n};\n\n\n";
          io::Printer::Print<char[13],char_const*>
                    (printer,"$clearedvalue$);\n};\n\n\n",(char (*) [13])"clearedvalue",
                     (char **)&key_type);
        }
        goto LAB_0024efdd;
      }
      if (*(int *)(field + 0x3c) == 3) goto LAB_0024ebb4;
      pcVar15 = "Clears the message field making it undefined.";
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    BVar17 = 5;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x3991c6);
    value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type.field_2._8_8_ = plVar7[3];
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)&local_78,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x3d2edd);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar6) {
      local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_88._8_8_ = plVar7[3];
      local_98._M_allocated_capacity = (size_type)&local_88;
    }
    else {
      local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_98._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_98._8_8_ = plVar7[1];
    *plVar7 = (long)paVar6;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_50._M_allocated_capacity = (size_type)"undefined";
    if (*(int *)(field + 0x3c) == 3) {
      local_50._M_allocated_capacity = (size_type)"[]";
    }
    BVar17 = 0x39ef2d;
    pbVar19 = &key_type;
    io::Printer::
    Print<char[6],char[46],char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string,char[13],char_const*>
              (printer,
               "/**\n * $jsdoc$\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return this.$settername$($clearedvalue$);\n};\n\n\n"
               ,(char (*) [6])"jsdoc",(char (*) [46])pcVar15,(char (*) [6])0x39ef2d,pbVar19,
               (char (*) [12])"clearername",&value_type,(char (*) [11])"settername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               (char (*) [13])"clearedvalue",(char **)&local_50._M_allocated_capacity);
    uVar18 = SUB81(pbVar19,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((char *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  pcVar15 = "clearername";
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"clearername","clearername",field);
LAB_0024efdd:
  bVar3 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)pcVar15);
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               *(Descriptor **)(field + 0x50));
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar17,(bool)uVar18);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x399473);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar10) {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type.field_2._8_8_ = plVar7[3];
      value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar10;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)&local_98,(_anonymous_namespace_ *)field,
               (FieldDescriptor *)value_type._M_string_length);
    io::Printer::
    Print<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,
               "/**\n * Returns whether this field is set.\n * @return {boolean}\n */\n$class$.prototype.$hasername$ = function() {\n  return jspb.Message.getField(this, $index$) != null;\n};\n\n\n"
               ,(char (*) [6])0x39ef2d,&key_type,(char (*) [10])"hasername",&value_type,
               (char (*) [6])0x3a4ffa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"hasername","hasername",field);
  }
  return;
}

Assistant:

void Generator::GenerateClassField(const GeneratorOptions& options,
                                   io::Printer* printer,
                                   const FieldDescriptor* field) const {
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    // Map field: special handling to instantiate the map object on demand.
    std::string key_type =
        JSFieldTypeAnnotation(options, key_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);
    std::string value_type =
        JSFieldTypeAnnotation(options, value_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        " * @param {boolean=} opt_noLazyCreate Do not create the map if\n"
        " * empty, instead returning `undefined`\n"
        " * @return {!jspb.Map<$keytype$,$valuetype$>}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Print(
        "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n"
        "  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Annotate("gettername", field);
    printer->Print(
        "      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
        "index", JSFieldIndex(field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(
          ",\n"
          "      $messageType$",
          "messageType", GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(
          ",\n"
          "      null");
    }

    printer->Print("));\n");

    printer->Print(
        "};\n"
        "\n"
        "\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field: special handling in order to wrap the underlying data
    // array with a message object.

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        "$comment$"
        " * @return {$type$}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "comment",
        FieldComments(field, BYTES_DEFAULT), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false));
    printer->Print(
        "$class$.prototype.$gettername$ = function() {\n"
        "  return /** @type{$type$} */ (\n"
        "    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, "
        "$index$$required$));\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "rpt", (field->is_repeated() ? "Repeated" : ""), "index",
        JSFieldIndex(field), "wrapperclass", SubmessageTypeRef(options, field),
        "required",
        (field->label() == FieldDescriptor::LABEL_REQUIRED ? ", 1" : ""));
    printer->Annotate("gettername", field);
    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        "*/\n"
        "$class$.prototype.$settername$ = function(value) {\n"
        "  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField(",
        "optionaltype",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ true,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "class", GetMessagePath(options, field->containing_type()),
        "settername", "set" + JSGetterName(options, field), "oneoftag",
        (field->containing_oneof() ? "Oneof" : ""), "repeatedtag",
        (field->is_repeated() ? "Repeated" : ""));
    printer->Annotate("settername", field);

    printer->Print(
        "this, $index$$oneofgroup$, value);\n"
        "};\n"
        "\n"
        "\n",
        "index", JSFieldIndex(field), "oneofgroup",
        (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                   : ""));

    if (field->is_repeated()) {
      GenerateRepeatedMessageHelperMethods(options, printer, field);
    }

  } else {
    bool untyped =
        false;

    // Simple (primitive) field, either singular or repeated.

    // TODO(b/26173701): Always use BYTES_DEFAULT for the getter return type;
    // at this point we "lie" to non-binary users and tell the return
    // type is always base64 string, pending a LSC to migrate to typed getters.
    BytesMode bytes_mode =
        field->type() == FieldDescriptor::TYPE_BYTES && !options.binary
            ? BYTES_B64
            : BYTES_DEFAULT;
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ bytes_mode);
    if (untyped) {
      printer->Print(
          "/**\n"
          " * @return {?} Raw field, untyped.\n"
          " */\n");
    } else {
      printer->Print(
          "/**\n"
          " * $fielddef$\n"
          "$comment$"
          " * @return {$type$}\n"
          " */\n",
          "fielddef", FieldDefinition(options, field), "comment",
          FieldComments(field, bytes_mode), "type", typed_annotation);
    }

    printer->Print("$class$.prototype.$gettername$ = function() {\n", "class",
                   GetMessagePath(options, field->containing_type()),
                   "gettername", "get" + JSGetterName(options, field));
    printer->Annotate("gettername", field);

    if (untyped) {
      printer->Print("  return ");
    } else {
      printer->Print("  return /** @type {$type$} */ (", "type",
                     typed_annotation);
    }

    bool use_default = !ReturnsNullWhenUnset(options, field);

    // Raw fields with no default set should just return undefined.
    if (untyped && !field->has_default_value()) {
      use_default = false;
    }

    // Repeated fields get initialized to their default in the constructor
    // (why?), so we emit a plain getField() call for them.
    if (field->is_repeated()) {
      use_default = false;
    }

    GenerateFieldValueExpression(printer, "this", field, use_default);

    if (untyped) {
      printer->Print(
          ";\n"
          "};\n"
          "\n"
          "\n");
    } else {
      printer->Print(
          ");\n"
          "};\n"
          "\n"
          "\n");
    }

    if (field->type() == FieldDescriptor::TYPE_BYTES && !untyped) {
      GenerateBytesWrapper(options, printer, field, BYTES_B64);
      GenerateBytesWrapper(options, printer, field, BYTES_U8);
    }

    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        " */\n",
        "class", GetMessagePath(options, field->containing_type()),
        "optionaltype",
        untyped ? "*"
                : JSFieldTypeAnnotation(options, field,
                                        /* is_setter_argument = */ true,
                                        /* force_present = */ false,
                                        /* singular_if_not_packed = */ false));

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        !field->is_repeated() && !field->is_map() &&
        !HasFieldPresence(options, field)) {
      // Proto3 non-repeated and non-map fields without presence use the
      // setProto3*Field function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.setProto3$typetag$Field(this, $index$, "
          "value);"
          "\n"
          "};\n"
          "\n"
          "\n",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "typetag",
          JSTypeTag(field), "index", JSFieldIndex(field));
      printer->Annotate("settername", field);
    } else {
      // Otherwise, use the regular setField function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.set$oneoftag$Field(this, $index$",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "oneoftag",
          (field->containing_oneof() ? "Oneof" : ""), "index",
          JSFieldIndex(field));
      printer->Annotate("settername", field);
      printer->Print(
          "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n"
          "};\n"
          "\n"
          "\n",
          "type",
          untyped ? "/** @type{string|number|boolean|Array|undefined} */(" : "",
          "typeclose", untyped ? ")" : "", "oneofgroup",
          (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                     : ""),
          "rptvalueinit", (field->is_repeated() ? " || []" : ""));
    }

    if (untyped) {
      printer->Print(
          "/**\n"
          " * Clears the value.\n"
          " * @return {!$class$} returns this\n"
          " */\n",
          "class", GetMessagePath(options, field->containing_type()));
    }

    if (field->is_repeated()) {
      GenerateRepeatedPrimitiveHelperMethods(options, printer, field, untyped);
    }
  }

  // Generate clearFoo() method for map fields, repeated fields, and other
  // fields with presence.
  if (field->is_map()) {
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears values from the map. The map will be non-null.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  this.$gettername$().clear();\n"
        "  return this;"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "gettername", "get" + JSGetterName(options, field));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (field->is_repeated() ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
              !field->is_required())) {
    // Fields where we can delegate to the regular setter.
    // clang-format off
    printer->Print(
        "/**\n"
        " * $jsdoc$\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return this.$settername$($clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
       "jsdoc", field->is_repeated()
           ? "Clears the list making it empty but non-null."
           : "Clears the message field making it undefined.",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "settername", "set" + JSGetterName(options, field),
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (HasFieldPresence(options, field)) {
    // Fields where we can't delegate to the regular setter because it doesn't
    // accept "undefined" as an argument.
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears the field making it undefined.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return jspb.Message.set$maybeoneof$Field(this, "
            "$index$$maybeoneofgroup$, ",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "maybeoneof", (field->containing_oneof() ? "Oneof" : ""),
        "maybeoneofgroup", (field->containing_oneof()
                            ? (", " + JSOneofArray(options, field))
                            : ""),
        "index", JSFieldIndex(field));
    // clang-format on
    printer->Annotate("clearername", field);
    printer->Print(
        "$clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
  }

  if (HasFieldPresence(options, field)) {
    printer->Print(
        "/**\n"
        " * Returns whether this field is set.\n"
        " * @return {boolean}\n"
        " */\n"
        "$class$.prototype.$hasername$ = function() {\n"
        "  return jspb.Message.getField(this, $index$) != null;\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()), "hasername",
        "has" + JSGetterName(options, field), "index", JSFieldIndex(field));
    printer->Annotate("hasername", field);
  }
}